

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlineBlocks.cpp
# Opt level: O3

void inlineBlocks(Module *module,Program *program)

{
  Function *pFVar1;
  pointer ppEVar2;
  Module *pMVar3;
  Func *this;
  Expr *pEVar4;
  Expr **expr;
  pointer ppEVar5;
  BasicBlock *block;
  Module *f;
  InliningVisitor iv;
  InliningVisitor local_40;
  
  pMVar3 = *(Module **)(module + 0x20);
  if (pMVar3 != module + 0x18) {
    do {
      f = pMVar3 + -0x38;
      if (pMVar3 == (Module *)0x0) {
        f = (Module *)0x0;
      }
      this = Program::getFunction(program,(Function *)f);
      for (pFVar1 = *(Function **)((Function *)f + 0x50); pFVar1 != (Function *)f + 0x48;
          pFVar1 = *(Function **)(pFVar1 + 8)) {
        block = (BasicBlock *)(pFVar1 + -0x18);
        if (pFVar1 == (Function *)0x0) {
          block = (BasicBlock *)0x0;
        }
        local_40.container = Func::createBlockIfNotExist(this,block);
        local_40.super_SimplifyingExprVisitor.super_ExprVisitor._vptr_ExprVisitor =
             (ExprVisitor)&PTR_visit_0017d520;
        ppEVar2 = ((local_40.container)->expressions).
                  super__Vector_base<Expr_*,_std::allocator<Expr_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        for (ppEVar5 = ((local_40.container)->expressions).
                       super__Vector_base<Expr_*,_std::allocator<Expr_*>_>._M_impl.
                       super__Vector_impl_data._M_start; ppEVar5 != ppEVar2; ppEVar5 = ppEVar5 + 1)
        {
          (*(*ppEVar5)->_vptr_Expr[2])(*ppEVar5,&local_40);
          pEVar4 = InliningVisitor::simplify(&local_40,*ppEVar5);
          *ppEVar5 = pEVar4;
        }
      }
      pMVar3 = *(Module **)(pMVar3 + 8);
    } while (pMVar3 != module + 0x18);
  }
  Program::addPass(program,InlineBlocks);
  return;
}

Assistant:

void inlineBlocks(const llvm::Module* module, Program& program) {
    assert(program.isPassCompleted(PassType::IdentifyInlinableBlocks));


    for (const llvm::Function& func : module->functions()) {
        auto* function = program.getFunction(&func);
        for (const auto& block : func) {
            auto* myBlock = function->createBlockIfNotExist(&block);
            InliningVisitor iv(myBlock);

            for (auto& expr : myBlock->expressions) {
                expr->accept(iv);
                expr = iv.simplify(expr);
            }
        }
    }

    program.addPass(PassType::InlineBlocks);
}